

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar uVar8;
  size_t sVar9;
  byte *pbVar10;
  uchar *puVar11;
  bool bVar12;
  size_t j;
  
  uVar5 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar6 = mode->bitdepth;
    if (uVar6 == 8) {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        uVar8 = in[sVar9];
        puVar11[-1] = uVar8;
        puVar11[-2] = uVar8;
        puVar11[-3] = uVar8;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar8 = 0xff;
          }
          else {
            uVar8 = -(mode->key_r != (uint)in[sVar9]);
          }
          *puVar11 = uVar8;
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    else if (uVar6 == 0x10) {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        uVar8 = in[sVar9 * 2];
        puVar11[-1] = uVar8;
        puVar11[-2] = uVar8;
        puVar11[-3] = uVar8;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar8 = 0xff;
          }
          else {
            uVar8 = -((uint)(ushort)(*(ushort *)(in + sVar9 * 2) << 8 |
                                    *(ushort *)(in + sVar9 * 2) >> 8) != mode->key_r);
          }
          *puVar11 = uVar8;
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    else {
      j = 0;
      puVar11 = buffer + 3;
      while (bVar12 = numpixels != 0, numpixels = numpixels - 1, bVar12) {
        uVar7 = readBitsFromReversedStream(&j,in,(ulong)mode->bitdepth);
        uVar8 = (uchar)((uVar7 * 0xff) / (uint)~(-1 << ((byte)uVar6 & 0x1f)));
        puVar11[-1] = uVar8;
        puVar11[-2] = uVar8;
        puVar11[-3] = uVar8;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar8 = 0xff;
          }
          else {
            uVar8 = -(uVar7 != mode->key_r);
          }
          *puVar11 = uVar8;
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      pbVar10 = in + 2;
      puVar11 = buffer + 3;
      while (bVar12 = numpixels != 0, numpixels = numpixels - 1, bVar12) {
        bVar1 = pbVar10[-2];
        puVar11[-3] = bVar1;
        bVar2 = pbVar10[-1];
        puVar11[-2] = bVar2;
        bVar3 = *pbVar10;
        puVar11[-1] = bVar3;
        if (has_alpha != 0) {
          uVar8 = 0xff;
          if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
             (mode->key_g == (uint)bVar2)) {
            uVar8 = -(mode->key_b != (uint)bVar3);
          }
          *puVar11 = uVar8;
        }
        pbVar10 = pbVar10 + 3;
        puVar11 = puVar11 + uVar5;
      }
    }
    else {
      puVar11 = buffer + 3;
      while (bVar12 = numpixels != 0, numpixels = numpixels - 1, bVar12) {
        puVar11[-3] = (uchar)*(ushort *)in;
        puVar11[-2] = (uchar)*(ushort *)((long)in + 2);
        uVar4 = *(ushort *)((long)in + 4);
        puVar11[-1] = (uchar)uVar4;
        if (has_alpha != 0) {
          uVar8 = 0xff;
          if (((mode->key_defined != 0) &&
              ((uint)(ushort)(*(ushort *)in << 8 | *(ushort *)in >> 8) == mode->key_r)) &&
             ((uint)(ushort)(*(ushort *)((long)in + 2) << 8 | *(ushort *)((long)in + 2) >> 8) ==
              mode->key_g)) {
            uVar8 = -((uint)CONCAT11((uchar)uVar4,*(undefined1 *)((long)in + 5)) != mode->key_b);
          }
          *puVar11 = uVar8;
        }
        in = (uchar *)((long)in + 6);
        puVar11 = puVar11 + uVar5;
      }
    }
    break;
  case LCT_PALETTE:
    j = 0;
    puVar11 = buffer + 3;
    for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
      if ((ulong)mode->bitdepth == 8) {
        uVar6 = (uint)in[sVar9];
      }
      else {
        uVar6 = readBitsFromReversedStream(&j,in,(ulong)mode->bitdepth);
      }
      if ((ulong)uVar6 < mode->palettesize) {
        uVar6 = uVar6 << 2;
        puVar11[-3] = mode->palette[uVar6];
        puVar11[-2] = mode->palette[(ulong)uVar6 + 1];
        puVar11[-1] = mode->palette[(ulong)uVar6 + 2];
        if (has_alpha != 0) {
          uVar8 = mode->palette[(ulong)uVar6 + 3];
LAB_0010e32e:
          *puVar11 = uVar8;
        }
      }
      else {
        puVar11[-3] = '\0';
        puVar11[-2] = '\0';
        puVar11[-1] = '\0';
        uVar8 = 0xff;
        if (has_alpha != 0) goto LAB_0010e32e;
      }
      puVar11 = puVar11 + uVar5;
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        uVar8 = in[sVar9 * 2];
        puVar11[-1] = uVar8;
        puVar11[-2] = uVar8;
        puVar11[-3] = uVar8;
        if (has_alpha != 0) {
          *puVar11 = in[sVar9 * 2 + 1];
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    else {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        uVar8 = in[sVar9 * 4];
        puVar11[-1] = uVar8;
        puVar11[-2] = uVar8;
        puVar11[-3] = uVar8;
        if (has_alpha != 0) {
          *puVar11 = in[sVar9 * 4 + 2];
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        puVar11[-3] = in[sVar9 * 4];
        puVar11[-2] = in[sVar9 * 4 + 1];
        puVar11[-1] = in[sVar9 * 4 + 2];
        if (has_alpha != 0) {
          *puVar11 = in[sVar9 * 4 + 3];
        }
        puVar11 = puVar11 + uVar5;
      }
    }
    else {
      puVar11 = buffer + 3;
      for (sVar9 = 0; numpixels != sVar9; sVar9 = sVar9 + 1) {
        puVar11[-3] = in[sVar9 * 8];
        puVar11[-2] = in[sVar9 * 8 + 2];
        puVar11[-1] = in[sVar9 * 8 + 4];
        if (has_alpha != 0) {
          *puVar11 = in[sVar9 * 8 + 6];
        }
        puVar11 = puVar11 + uVar5;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
	unsigned has_alpha, const unsigned char* in,
	const LodePNGColorMode* mode)
{
	unsigned num_channels = has_alpha ? 4 : 3;
	size_t i;
	if (mode->colortype == LCT_GREY)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i];
				if (has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
			}
		}
		else if (mode->bitdepth == 16)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2];
				if (has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
			}
		}
		else
		{
			unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
			size_t j = 0;
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
				buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
				if (has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_RGB)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 3 + 0];
				buffer[1] = in[i * 3 + 1];
				buffer[2] = in[i * 3 + 2];
				if (has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
					&& buffer[1] == mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 6 + 0];
				buffer[1] = in[i * 6 + 2];
				buffer[2] = in[i * 6 + 4];
				if (has_alpha) buffer[3] = mode->key_defined
					&& 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
					&& 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
					&& 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_PALETTE)
	{
		unsigned index;
		size_t j = 0;
		for (i = 0; i != numpixels; ++i, buffer += num_channels)
		{
			if (mode->bitdepth == 8) index = in[i];
			else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

			if (index >= mode->palettesize)
			{
				/*This is an error according to the PNG spec, but most PNG decoders make it black instead.
				Done here too, slightly faster due to no error handling needed.*/
				buffer[0] = buffer[1] = buffer[2] = 0;
				if (has_alpha) buffer[3] = 255;
			}
			else
			{
				buffer[0] = mode->palette[index * 4 + 0];
				buffer[1] = mode->palette[index * 4 + 1];
				buffer[2] = mode->palette[index * 4 + 2];
				if (has_alpha) buffer[3] = mode->palette[index * 4 + 3];
			}
		}
	}
	else if (mode->colortype == LCT_GREY_ALPHA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
				if (has_alpha) buffer[3] = in[i * 2 + 1];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
				if (has_alpha) buffer[3] = in[i * 4 + 2];
			}
		}
	}
	else if (mode->colortype == LCT_RGBA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 4 + 0];
				buffer[1] = in[i * 4 + 1];
				buffer[2] = in[i * 4 + 2];
				if (has_alpha) buffer[3] = in[i * 4 + 3];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 8 + 0];
				buffer[1] = in[i * 8 + 2];
				buffer[2] = in[i * 8 + 4];
				if (has_alpha) buffer[3] = in[i * 8 + 6];
			}
		}
	}
}